

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O1

void ncnn::vresize_one(short *rows0p,short *rows1p,int wsize,uchar *Dp,short b0,short b1)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  uint uVar17;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  long lVar18;
  int iVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  auVar21 = ZEXT416((uint)CONCAT62(in_register_00000082,b0));
  auVar21 = pshuflw(auVar21,auVar21,0);
  auVar21._4_4_ = auVar21._0_4_;
  auVar21._8_4_ = auVar21._0_4_;
  auVar21._12_4_ = auVar21._0_4_;
  auVar22 = ZEXT416((uint)CONCAT62(in_register_0000008a,b1));
  auVar22 = pshuflw(auVar22,auVar22,0);
  auVar22._4_4_ = auVar22._0_4_;
  auVar22._8_4_ = auVar22._0_4_;
  auVar22._12_4_ = auVar22._0_4_;
  uVar17 = 0;
  if (0xf < wsize) {
    uVar17 = wsize & 0x7ffffff0;
    iVar19 = 0xf;
    do {
      auVar23 = pmulhw(*(undefined1 (*) [16])rows0p,auVar21);
      auVar25 = pmulhw(*(undefined1 (*) [16])rows1p,auVar22);
      auVar24 = pmulhw(*(undefined1 (*) [16])((long)rows0p + 0x10),auVar21);
      auVar27 = pmulhw(*(undefined1 (*) [16])((long)rows1p + 0x10),auVar22);
      auVar26._0_2_ = auVar25._0_2_ + auVar23._0_2_ + 2;
      auVar26._2_2_ = auVar25._2_2_ + auVar23._2_2_ + 2;
      auVar26._4_2_ = auVar25._4_2_ + auVar23._4_2_ + 2;
      auVar26._6_2_ = auVar25._6_2_ + auVar23._6_2_ + 2;
      auVar26._8_2_ = auVar25._8_2_ + auVar23._8_2_ + 2;
      auVar26._10_2_ = auVar25._10_2_ + auVar23._10_2_ + 2;
      auVar26._12_2_ = auVar25._12_2_ + auVar23._12_2_ + 2;
      auVar26._14_2_ = auVar25._14_2_ + auVar23._14_2_ + 2;
      auVar23 = psraw(auVar26,2);
      auVar25._0_2_ = auVar27._0_2_ + auVar24._0_2_ + 2;
      auVar25._2_2_ = auVar27._2_2_ + auVar24._2_2_ + 2;
      auVar25._4_2_ = auVar27._4_2_ + auVar24._4_2_ + 2;
      auVar25._6_2_ = auVar27._6_2_ + auVar24._6_2_ + 2;
      auVar25._8_2_ = auVar27._8_2_ + auVar24._8_2_ + 2;
      auVar25._10_2_ = auVar27._10_2_ + auVar24._10_2_ + 2;
      auVar25._12_2_ = auVar27._12_2_ + auVar24._12_2_ + 2;
      auVar25._14_2_ = auVar27._14_2_ + auVar24._14_2_ + 2;
      auVar24 = psraw(auVar25,2);
      sVar1 = auVar23._0_2_;
      sVar2 = auVar23._2_2_;
      sVar3 = auVar23._4_2_;
      sVar4 = auVar23._6_2_;
      sVar5 = auVar23._8_2_;
      sVar6 = auVar23._10_2_;
      sVar7 = auVar23._12_2_;
      sVar8 = auVar23._14_2_;
      sVar9 = auVar24._0_2_;
      sVar10 = auVar24._2_2_;
      sVar11 = auVar24._4_2_;
      sVar12 = auVar24._6_2_;
      sVar13 = auVar24._8_2_;
      sVar14 = auVar24._10_2_;
      sVar15 = auVar24._12_2_;
      sVar16 = auVar24._14_2_;
      *Dp = (0 < sVar1) * (sVar1 < 0x100) * auVar23[0] - (0xff < sVar1);
      Dp[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar23[2] - (0xff < sVar2);
      Dp[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar23[4] - (0xff < sVar3);
      Dp[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar23[6] - (0xff < sVar4);
      Dp[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar23[8] - (0xff < sVar5);
      Dp[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar23[10] - (0xff < sVar6);
      Dp[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar23[0xc] - (0xff < sVar7);
      Dp[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar23[0xe] - (0xff < sVar8);
      Dp[8] = (0 < sVar9) * (sVar9 < 0x100) * auVar24[0] - (0xff < sVar9);
      Dp[9] = (0 < sVar10) * (sVar10 < 0x100) * auVar24[2] - (0xff < sVar10);
      Dp[10] = (0 < sVar11) * (sVar11 < 0x100) * auVar24[4] - (0xff < sVar11);
      Dp[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar24[6] - (0xff < sVar12);
      Dp[0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar24[8] - (0xff < sVar13);
      Dp[0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar24[10] - (0xff < sVar14);
      Dp[0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar24[0xc] - (0xff < sVar15);
      Dp[0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar24[0xe] - (0xff < sVar16);
      Dp = Dp + 0x10;
      rows0p = (short *)((long)rows0p + 0x20);
      rows1p = (short *)((long)rows1p + 0x20);
      iVar19 = iVar19 + 0x10;
    } while (iVar19 < wsize);
  }
  uVar20 = uVar17 | 7;
  while ((int)uVar20 < wsize) {
    auVar23 = pmulhw(*(undefined1 (*) [16])rows0p,auVar21);
    auVar24 = pmulhw(*(undefined1 (*) [16])rows1p,auVar22);
    auVar27._0_2_ = auVar24._0_2_ + auVar23._0_2_ + 2;
    auVar27._2_2_ = auVar24._2_2_ + auVar23._2_2_ + 2;
    auVar27._4_2_ = auVar24._4_2_ + auVar23._4_2_ + 2;
    auVar27._6_2_ = auVar24._6_2_ + auVar23._6_2_ + 2;
    auVar27._8_2_ = auVar24._8_2_ + auVar23._8_2_ + 2;
    auVar27._10_2_ = auVar24._10_2_ + auVar23._10_2_ + 2;
    auVar27._12_2_ = auVar24._12_2_ + auVar23._12_2_ + 2;
    auVar27._14_2_ = auVar24._14_2_ + auVar23._14_2_ + 2;
    auVar23 = psraw(auVar27,2);
    sVar1 = auVar23._0_2_;
    sVar2 = auVar23._2_2_;
    sVar3 = auVar23._4_2_;
    sVar4 = auVar23._6_2_;
    sVar5 = auVar23._8_2_;
    sVar6 = auVar23._10_2_;
    sVar7 = auVar23._12_2_;
    sVar8 = auVar23._14_2_;
    *(ulong *)Dp = CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar23[0xe] - (0xff < sVar8),
                            CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar23[0xc] - (0xff < sVar7),
                                     CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar23[10] -
                                              (0xff < sVar6),
                                              CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar23[8] -
                                                       (0xff < sVar5),
                                                       CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                                auVar23[6] - (0xff < sVar4),
                                                                CONCAT12((0 < sVar3) *
                                                                         (sVar3 < 0x100) *
                                                                         auVar23[4] - (0xff < sVar3)
                                                                         ,CONCAT11((0 < sVar2) *
                                                                                   (sVar2 < 0x100) *
                                                                                   auVar23[2] -
                                                                                   (0xff < sVar2),
                                                                                   (0 < sVar1) *
                                                                                   (sVar1 < 0x100) *
                                                                                   auVar23[0] -
                                                                                   (0xff < sVar1))))
                                                      ))));
    Dp = Dp + 8;
    rows0p = (short *)((long)rows0p + 0x10);
    rows1p = (short *)((long)rows1p + 0x10);
    uVar20 = uVar17 + 0xf;
    uVar17 = uVar17 + 8;
  }
  if ((int)uVar17 < wsize) {
    lVar18 = 0;
    do {
      Dp[lVar18] = (uchar)(((uint)((int)*(short *)(*(undefined1 (*) [16])rows0p + lVar18 * 2) *
                                  (int)b0) >> 0x10) +
                           ((uint)((int)*(short *)(*(undefined1 (*) [16])rows1p + lVar18 * 2) *
                                  (int)b1) >> 0x10) + 2 >> 2);
      lVar18 = lVar18 + 1;
    } while (wsize - uVar17 != (int)lVar18);
  }
  return;
}

Assistant:

static void vresize_one(const short* rows0p, const short* rows1p, int wsize, unsigned char* Dp, short b0, short b1)
{
    int dx = 0;
#if __ARM_NEON
    int16x8_t _b0 = vdupq_n_s16(b0);
    int16x8_t _b1 = vdupq_n_s16(b1);
    for (; dx + 15 < wsize; dx += 16)
    {
        int16x8_t _r00 = vld1q_s16(rows0p);
        int16x8_t _r01 = vld1q_s16(rows0p + 8);
        int16x8_t _r10 = vld1q_s16(rows1p);
        int16x8_t _r11 = vld1q_s16(rows1p + 8);
        int16x8_t _acc0 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r00, _b0), 1), vqdmulhq_s16(_r10, _b1), 1);
        int16x8_t _acc1 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r01, _b0), 1), vqdmulhq_s16(_r11, _b1), 1);
        uint8x16_t _Dp = vcombine_u8(vqrshrun_n_s16(_acc0, 2), vqrshrun_n_s16(_acc1, 2));
        vst1q_u8(Dp, _Dp);
        Dp += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        int16x8_t _r0 = vld1q_s16(rows0p);
        int16x8_t _r1 = vld1q_s16(rows1p);
        int16x8_t _acc = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r0, _b0), 1), vqdmulhq_s16(_r1, _b1), 1);
        uint8x8_t _Dp = vqrshrun_n_s16(_acc, 2);
        vst1_u8(Dp, _Dp);
        Dp += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __ARM_NEON
#if __SSE2__
    __m128i _b0 = _mm_set1_epi16(b0);
    __m128i _b1 = _mm_set1_epi16(b1);
    __m128i _v2 = _mm_set1_epi16(2);
    for (; dx + 15 < wsize; dx += 16)
    {
        __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
        __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
        __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
        __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
        _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
        _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
        __m128i _Dp = _mm_packus_epi16(_acc0, _acc1);
        _mm_storeu_si128((__m128i*)Dp, _Dp);
        Dp += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _acc = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
        _acc = _mm_srai_epi16(_mm_add_epi16(_acc, _v2), 2);
        __m128i _Dp = _mm_packus_epi16(_acc, _acc);
        _mm_storel_epi64((__m128i*)Dp, _Dp);
        Dp += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __SSE2__
    for (; dx < wsize; dx++)
    {
        short s0 = *rows0p++;
        short s1 = *rows1p++;

        *Dp++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
    }
}